

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::parseParamOverrides
          (Compilation *this,flat_hash_map<string_view,_const_ConstantValue_*> *results)

{
  undefined1 *puVar1;
  ScriptSession *pSVar2;
  Segment *pSVar3;
  ScriptSession *pSVar4;
  char cVar5;
  ScriptSession *pSVar6;
  NameSyntax *pNVar7;
  Diagnostic *this_00;
  int iVar8;
  ScriptSession *this_01;
  ScriptSession *arg;
  string_view text;
  string_view name_00;
  string_view name;
  ConstantValue cv;
  Diagnostics localDiags;
  ScriptSession session;
  ConstantValue *local_cf8;
  undefined1 local_cf0 [48];
  char local_cc0;
  Diagnostics local_cb8;
  ScriptSession local_bc0;
  
  if ((this->options).paramOverrides.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->options).paramOverrides.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = (ScriptSession *)results;
    ScriptSession::ScriptSession(&local_bc0);
    arg = (ScriptSession *)
          (this->options).paramOverrides.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (ScriptSession *)
             (this->options).paramOverrides.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (arg != pSVar2) {
      do {
        pSVar6 = (ScriptSession *)std::__cxx11::string::find((char)arg,0x3d);
        if (pSVar6 == (ScriptSession *)0xffffffffffffffff) {
LAB_0021c479:
          this_00 = Scope::addDiag(&((this->root)._M_t.
                                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                    _M_head_impl)->super_Scope,(DiagCode)0xa000d,
                                   (SourceLocation)0xffffffffffffffff);
          this_01 = arg;
          Diagnostic::operator<<(this_00,(string *)arg);
        }
        else {
          local_cb8.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.data_ =
               (pointer)local_cb8.super_SmallVector<slang::Diagnostic,_2UL>.
                        super_SmallVectorBase<slang::Diagnostic>.firstElement;
          local_cb8.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.len = 0;
          local_cb8.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.cap = 2;
          pSVar3 = (arg->compilation).super_BumpAllocator.head;
          pSVar4 = (ScriptSession *)(arg->compilation).super_BumpAllocator.endPtr;
          this_01 = pSVar6;
          if (pSVar4 < pSVar6) {
            this_01 = pSVar4;
          }
          name_00._M_str = (char *)pSVar3;
          name_00._M_len = (size_t)this_01;
          local_cf0._0_8_ = this_01;
          local_cf0._8_8_ = pSVar3;
          pNVar7 = tryParseName(this,name_00,&local_cb8);
          if (((pNVar7->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) &&
             ((EntryPointer)
              local_cb8.super_SmallVector<slang::Diagnostic,_2UL>.
              super_SmallVectorBase<slang::Diagnostic>.len == (EntryPointer)0x0)) {
            puVar1 = (undefined1 *)((long)&(pSVar6->compilation).super_BumpAllocator.head + 1);
            if (pSVar4 <= pSVar6) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",puVar1,pSVar4);
            }
            this_01 = &local_bc0;
            text._M_str = puVar1 + (long)&pSVar3->prev;
            text._M_len = (long)pSVar4 - (long)puVar1;
            ScriptSession::eval((ConstantValue *)(local_cf0 + 0x10),this_01,text);
            cVar5 = local_cc0;
            if (local_cc0 == '\0') {
              iVar8 = 0;
            }
            else {
              local_cf8 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                                    (&this->constantAllocator,(ConstantValue *)(local_cf0 + 0x10));
              this_01 = (ScriptSession *)local_cf0;
              ska::detailv3::
              sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>>>>
              ::emplace<std::basic_string_view<char,std::char_traits<char>>&,slang::ConstantValue*>
                        ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>>>>
                          *)results,(basic_string_view<char,_std::char_traits<char>_> *)this_01,
                         &local_cf8);
              iVar8 = 3;
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)(local_cf0 + 0x10));
            if (cVar5 == '\0') goto LAB_0021c469;
          }
          else {
LAB_0021c469:
            iVar8 = 0;
          }
          SmallVectorBase<slang::Diagnostic>::cleanup
                    ((SmallVectorBase<slang::Diagnostic> *)&local_cb8,(EVP_PKEY_CTX *)this_01);
          if (iVar8 == 0) goto LAB_0021c479;
        }
        arg = (ScriptSession *)&(arg->compilation).options.maxConstexprBacktrace;
      } while (arg != pSVar2);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&local_bc0.evalContext.diags,
               (EVP_PKEY_CTX *)this_01);
    if (local_bc0.evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ !=
        (pointer)local_bc0.evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                 firstElement) {
      free(local_bc0.evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
    }
    SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
              (&local_bc0.evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,
               (EVP_PKEY_CTX *)this_01);
    std::
    vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
    ::~vector(&local_bc0.syntaxTrees);
    ~Compilation(&local_bc0.compilation);
  }
  return;
}

Assistant:

void Compilation::parseParamOverrides(flat_hash_map<string_view, const ConstantValue*>& results) {
    if (options.paramOverrides.empty())
        return;

    ScriptSession session;
    for (auto& opt : options.paramOverrides) {
        // Strings must be of the form <name>=<value>
        size_t index = opt.find('=');
        if (index != std::string::npos) {
            // We found the equals sign, so split out the name and parse that.
            // For now, the name must always be a simple identifier.
            Diagnostics localDiags;
            string_view optView = opt;
            string_view name = optView.substr(0, index);
            if (tryParseName(name, localDiags).kind == SyntaxKind::IdentifierName &&
                localDiags.empty()) {

                // The name is good, evaluate the value string. Using the ScriptSession
                // here is a little bit lazy but oh well, this executes almost never
                // compared to everything else during compilation.
                string_view value = optView.substr(index + 1);
                ConstantValue cv = session.eval(value);
                if (cv) {
                    // Success, store in the map so we can apply the value later.
                    results.emplace(name, allocConstant(std::move(cv)));
                    continue;
                }
            }
        }

        root->addDiag(diag::InvalidParamOverrideOpt, SourceLocation::NoLocation) << opt;
    }
}